

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_trc.c
# Opt level: O0

void trc_apply_level_by_category(int category,int lvl)

{
  ulong local_18;
  size_t i;
  int lvl_local;
  int category_local;
  
  for (local_18 = 0; local_18 < 0xd; local_18 = local_18 + 1) {
    if ((category == 0) || ((trc_cfts[local_18].category & category) != 0)) {
      (trc_cfts[local_18].cft)->log_level = lvl;
    }
  }
  for (local_18 = 0; local_18 < 6; local_18 = local_18 + 1) {
    if ((category == 0) || ((trc_feats[local_18].category & category) != 0)) {
      (trc_feats[local_18].feat)->log_level = lvl;
    }
  }
  return;
}

Assistant:

static void trc_apply_level_by_category(int category, int lvl)
{
  size_t i;

  for(i = 0; i < ARRAYSIZE(trc_cfts); ++i) {
    if(!category || (trc_cfts[i].category & category))
      trc_cfts[i].cft->log_level = lvl;
  }
  for(i = 0; i < ARRAYSIZE(trc_feats); ++i) {
    if(!category || (trc_feats[i].category & category))
      trc_feats[i].feat->log_level = lvl;
  }
}